

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  uint old_limit;
  uint limit;
  uint cur;
  char *q;
  uint local_30;
  int local_4;
  
  *(undefined8 *)(in_RDI + 0x18) = in_RSI;
  if (*(int *)(in_RDI + 0x30) == 0) {
    local_4 = stbi__err("output buffer limit");
  }
  else {
    uVar1 = (int)*(undefined8 *)(in_RDI + 0x18) - (int)*(undefined8 *)(in_RDI + 0x20);
    local_30 = (int)*(undefined8 *)(in_RDI + 0x28) - (int)*(undefined8 *)(in_RDI + 0x20);
    if (-uVar1 - 1 < in_EDX) {
      local_4 = stbi__err("outofmem");
    }
    else {
      for (; local_30 < uVar1 + in_EDX; local_30 = local_30 << 1) {
        if (0x7fffffff < local_30) {
          iVar2 = stbi__err("outofmem");
          return iVar2;
        }
      }
      pvVar3 = realloc(*(void **)(in_RDI + 0x20),(ulong)local_30);
      if (pvVar3 == (void *)0x0) {
        local_4 = stbi__err("outofmem");
      }
      else {
        *(void **)(in_RDI + 0x20) = pvVar3;
        *(ulong *)(in_RDI + 0x18) = (long)pvVar3 + (ulong)uVar1;
        *(ulong *)(in_RDI + 0x28) = (long)pvVar3 + (ulong)local_30;
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   unsigned int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (unsigned int) (z->zout - z->zout_start);
   limit = old_limit = (unsigned) (z->zout_end - z->zout_start);
   if (UINT_MAX - cur < (unsigned) n) return stbi__err("outofmem", "Out of memory");
   while (cur + n > limit) {
      if(limit > UINT_MAX / 2) return stbi__err("outofmem", "Out of memory");
      limit *= 2;
   }
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}